

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clufactor.hpp
# Opt level: O3

int __thiscall
soplex::
CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::vSolveUpdateRight(CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    *this,number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                          *vec,int *ridx,int n,
                   number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                   *eps)

{
  uint *puVar1;
  int iVar2;
  undefined8 uVar3;
  int iVar4;
  int iVar5;
  bool bVar6;
  uint uVar7;
  long lVar8;
  cpp_dec_float<100U,_int,_void> *v;
  cpp_dec_float<100U,_int,_void> *pcVar9;
  long lVar10;
  int *piVar11;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *pnVar12;
  undefined8 uVar13;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result_1;
  cpp_dec_float<100U,_int,_void> local_228;
  int local_1d4;
  uint local_1d0;
  int local_1cc;
  cpp_dec_float<100U,_int,_void> local_1c8;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_170;
  int *local_168;
  pointer local_160;
  int *local_158;
  int *local_150;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_148;
  long local_140;
  int *local_138;
  long local_130;
  cpp_dec_float<100U,_int,_void> local_128;
  cpp_dec_float<100U,_int,_void> local_d8;
  cpp_dec_float<100U,_int,_void> local_88;
  
  local_1c8.fpclass = cpp_dec_float_finite;
  local_1c8.prec_elem = 0x10;
  local_1c8.data._M_elems[0] = 0;
  local_1c8.data._M_elems[1] = 0;
  local_1c8.data._M_elems[2] = 0;
  local_1c8.data._M_elems[3] = 0;
  local_1c8.data._M_elems[4] = 0;
  local_1c8.data._M_elems[5] = 0;
  local_1c8.data._M_elems[6] = 0;
  local_1c8.data._M_elems[7] = 0;
  local_1c8.data._M_elems[8] = 0;
  local_1c8.data._M_elems[9] = 0;
  local_1c8.data._M_elems[10] = 0;
  local_1c8.data._M_elems[0xb] = 0;
  local_1c8.data._M_elems[0xc] = 0;
  local_1c8.data._M_elems[0xd] = 0;
  local_1c8.data._M_elems._56_5_ = 0;
  local_1c8.data._M_elems[0xf]._1_3_ = 0;
  local_1c8.exp = 0;
  local_1c8.neg = false;
  local_1d4 = (this->l).firstUnused;
  iVar4 = (this->l).firstUpdate;
  lVar10 = (long)iVar4;
  if (iVar4 < local_1d4) {
    local_160 = (this->l).val.
                super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
    local_168 = (this->l).idx;
    local_150 = (this->l).row;
    local_158 = (this->l).start;
    local_170 = vec;
    local_148 = eps;
    local_138 = ridx;
    do {
      iVar4 = local_150[lVar10];
      local_128.data._M_elems._0_8_ = *(undefined8 *)vec[iVar4].m_backend.data._M_elems;
      local_128.data._M_elems._8_8_ = *(undefined8 *)(vec[iVar4].m_backend.data._M_elems + 2);
      puVar1 = vec[iVar4].m_backend.data._M_elems + 4;
      local_128.data._M_elems._16_8_ = *(undefined8 *)puVar1;
      local_128.data._M_elems._24_8_ = *(undefined8 *)(puVar1 + 2);
      puVar1 = vec[iVar4].m_backend.data._M_elems + 8;
      local_128.data._M_elems._32_8_ = *(undefined8 *)puVar1;
      local_128.data._M_elems._40_8_ = *(undefined8 *)(puVar1 + 2);
      puVar1 = vec[iVar4].m_backend.data._M_elems + 0xc;
      local_128.data._M_elems._48_8_ = *(undefined8 *)puVar1;
      local_128.data._M_elems._56_8_ = *(undefined8 *)(puVar1 + 2);
      local_228.exp = vec[iVar4].m_backend.exp;
      local_128.neg = vec[iVar4].m_backend.neg;
      local_128.fpclass = vec[iVar4].m_backend.fpclass;
      local_128.prec_elem = vec[iVar4].m_backend.prec_elem;
      local_228.data._M_elems._0_8_ = *(undefined8 *)vec[iVar4].m_backend.data._M_elems;
      local_228.data._M_elems._8_8_ = *(undefined8 *)(vec[iVar4].m_backend.data._M_elems + 2);
      puVar1 = vec[iVar4].m_backend.data._M_elems + 4;
      local_228.data._M_elems._16_8_ = *(undefined8 *)puVar1;
      local_228.data._M_elems._24_8_ = *(undefined8 *)(puVar1 + 2);
      puVar1 = vec[iVar4].m_backend.data._M_elems + 8;
      local_228.data._M_elems._32_8_ = *(undefined8 *)puVar1;
      local_228.data._M_elems._40_8_ = *(undefined8 *)(puVar1 + 2);
      puVar1 = vec[iVar4].m_backend.data._M_elems + 0xc;
      local_228.data._M_elems._48_8_ = *(undefined8 *)puVar1;
      uVar3 = *(undefined8 *)(puVar1 + 2);
      local_228.data._M_elems._56_5_ = SUB85(uVar3,0);
      local_228.data._M_elems[0xf]._1_3_ = (undefined3)((ulong)uVar3 >> 0x28);
      local_88.data._M_elems._0_8_ = *(undefined8 *)(local_148->m_backend).data._M_elems;
      local_88.data._M_elems._8_8_ = *(undefined8 *)((local_148->m_backend).data._M_elems + 2);
      local_88.data._M_elems._16_8_ = *(undefined8 *)((local_148->m_backend).data._M_elems + 4);
      local_88.data._M_elems._24_8_ = *(undefined8 *)((local_148->m_backend).data._M_elems + 6);
      local_88.data._M_elems._32_8_ = *(undefined8 *)((local_148->m_backend).data._M_elems + 8);
      local_88.data._M_elems._40_8_ = *(undefined8 *)((local_148->m_backend).data._M_elems + 10);
      local_88.data._M_elems._48_8_ = *(undefined8 *)((local_148->m_backend).data._M_elems + 0xc);
      local_88.data._M_elems._56_8_ = *(undefined8 *)((local_148->m_backend).data._M_elems + 0xe);
      local_88.exp = (local_148->m_backend).exp;
      local_88.neg = (local_148->m_backend).neg;
      local_88.fpclass = (local_148->m_backend).fpclass;
      local_88.prec_elem = (local_148->m_backend).prec_elem;
      local_228.prec_elem = local_128.prec_elem;
      local_228.fpclass = local_128.fpclass;
      local_228.neg = local_128.neg;
      if ((local_128.neg == true) &&
         (local_228.data._M_elems[0] != 0 || local_128.fpclass != cpp_dec_float_finite)) {
        local_228.neg = false;
      }
      local_140 = lVar10;
      if ((local_88.fpclass != cpp_dec_float_NaN && local_128.fpclass != cpp_dec_float_NaN) &&
         (local_128.exp = local_228.exp,
         iVar4 = boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::compare
                           (&local_228,&local_88), 0 < iVar4)) {
        lVar8 = (long)local_158[lVar10];
        iVar4 = local_158[lVar10 + 1];
        if (local_158[lVar10] < iVar4) {
          pcVar9 = &local_160[lVar8].m_backend;
          piVar11 = local_168 + lVar8;
          local_130 = lVar8;
          do {
            iVar2 = *piVar11;
            local_138[n] = iVar2;
            local_1c8.data._M_elems._0_8_ = *(undefined8 *)vec[iVar2].m_backend.data._M_elems;
            local_1c8.data._M_elems._8_8_ = *(undefined8 *)(vec[iVar2].m_backend.data._M_elems + 2);
            puVar1 = vec[iVar2].m_backend.data._M_elems + 4;
            local_1c8.data._M_elems._16_8_ = *(undefined8 *)puVar1;
            local_1c8.data._M_elems._24_8_ = *(undefined8 *)(puVar1 + 2);
            puVar1 = vec[iVar2].m_backend.data._M_elems + 8;
            local_1c8.data._M_elems._32_8_ = *(undefined8 *)puVar1;
            local_1c8.data._M_elems._40_8_ = *(undefined8 *)(puVar1 + 2);
            puVar1 = vec[iVar2].m_backend.data._M_elems + 0xc;
            local_1c8.data._M_elems._48_8_ = *(undefined8 *)puVar1;
            uVar3 = *(undefined8 *)(puVar1 + 2);
            local_1c8.data._M_elems._56_5_ = SUB85(uVar3,0);
            local_1c8.data._M_elems[0xf]._1_3_ = (undefined3)((ulong)uVar3 >> 0x28);
            local_1c8.exp = vec[iVar2].m_backend.exp;
            local_1c8.neg = vec[iVar2].m_backend.neg;
            local_1c8.fpclass = vec[iVar2].m_backend.fpclass;
            local_1c8.prec_elem = vec[iVar2].m_backend.prec_elem;
            uVar7 = 0;
            local_1cc = n;
            if (local_1c8.fpclass != cpp_dec_float_NaN) {
              boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::
              cpp_dec_float<long_long>(&local_228,0,(type *)0x0);
              iVar5 = boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::compare
                                (&local_1c8,&local_228);
              uVar7 = (uint)(iVar5 == 0);
            }
            local_d8.fpclass = cpp_dec_float_finite;
            local_d8.prec_elem = 0x10;
            local_d8.data._M_elems[0] = 0;
            local_d8.data._M_elems[1] = 0;
            local_d8.data._M_elems[2] = 0;
            local_d8.data._M_elems[3] = 0;
            local_d8.data._M_elems[4] = 0;
            local_d8.data._M_elems[5] = 0;
            local_d8.data._M_elems[6] = 0;
            local_d8.data._M_elems[7] = 0;
            local_d8.data._M_elems[8] = 0;
            local_d8.data._M_elems[9] = 0;
            local_d8.data._M_elems[10] = 0;
            local_d8.data._M_elems[0xb] = 0;
            local_d8.data._M_elems[0xc] = 0;
            local_d8.data._M_elems[0xd] = 0;
            local_d8.data._M_elems._56_5_ = 0;
            local_d8.data._M_elems[0xf]._1_3_ = 0;
            local_d8.exp = 0;
            local_d8.neg = false;
            v = &local_128;
            if (pcVar9 != &local_d8) {
              local_d8.data._M_elems[0xc] = local_128.data._M_elems[0xc];
              local_d8.data._M_elems[0xd] = local_128.data._M_elems[0xd];
              local_d8.data._M_elems._56_5_ = local_128.data._M_elems._56_5_;
              local_d8.data._M_elems[0xf]._1_3_ = local_128.data._M_elems[0xf]._1_3_;
              local_d8.data._M_elems[8] = local_128.data._M_elems[8];
              local_d8.data._M_elems[9] = local_128.data._M_elems[9];
              local_d8.data._M_elems[10] = local_128.data._M_elems[10];
              local_d8.data._M_elems[0xb] = local_128.data._M_elems[0xb];
              local_d8.data._M_elems[4] = local_128.data._M_elems[4];
              local_d8.data._M_elems[5] = local_128.data._M_elems[5];
              local_d8.data._M_elems[6] = local_128.data._M_elems[6];
              local_d8.data._M_elems[7] = local_128.data._M_elems[7];
              local_d8.data._M_elems[0] = local_128.data._M_elems[0];
              local_d8.data._M_elems[1] = local_128.data._M_elems[1];
              local_d8.data._M_elems[2] = local_128.data._M_elems[2];
              local_d8.data._M_elems[3] = local_128.data._M_elems[3];
              local_d8.exp = local_128.exp;
              local_d8.neg = local_128.neg;
              local_d8.prec_elem = local_128.prec_elem;
              local_d8.fpclass = local_128.fpclass;
              v = pcVar9;
            }
            local_1d0 = uVar7;
            boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator*=(&local_d8,v)
            ;
            local_228.data._M_elems[0] = local_1c8.data._M_elems[0];
            local_228.data._M_elems[1] = local_1c8.data._M_elems[1];
            local_228.data._M_elems[2] = local_1c8.data._M_elems[2];
            local_228.data._M_elems[3] = local_1c8.data._M_elems[3];
            local_228.data._M_elems[4] = local_1c8.data._M_elems[4];
            local_228.data._M_elems[5] = local_1c8.data._M_elems[5];
            local_228.data._M_elems[6] = local_1c8.data._M_elems[6];
            local_228.data._M_elems[7] = local_1c8.data._M_elems[7];
            local_228.data._M_elems[8] = local_1c8.data._M_elems[8];
            local_228.data._M_elems[9] = local_1c8.data._M_elems[9];
            local_228.data._M_elems[10] = local_1c8.data._M_elems[10];
            local_228.data._M_elems[0xb] = local_1c8.data._M_elems[0xb];
            local_228.data._M_elems[0xc] = local_1c8.data._M_elems[0xc];
            local_228.data._M_elems[0xd] = local_1c8.data._M_elems[0xd];
            local_228.data._M_elems._56_5_ = local_1c8.data._M_elems._56_5_;
            local_228.data._M_elems[0xf]._1_3_ = local_1c8.data._M_elems[0xf]._1_3_;
            local_228.exp = local_1c8.exp;
            local_228.neg = local_1c8.neg;
            local_228.fpclass = local_1c8.fpclass;
            local_228.prec_elem = local_1c8.prec_elem;
            boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator-=
                      (&local_228,&local_d8);
            local_1c8.data._M_elems[0] = local_228.data._M_elems[0];
            local_1c8.data._M_elems[1] = local_228.data._M_elems[1];
            uVar3 = local_1c8.data._M_elems._0_8_;
            local_1c8.data._M_elems[0] = local_228.data._M_elems[0];
            local_1c8.data._M_elems[1] = local_228.data._M_elems[1];
            local_1c8.data._M_elems[2] = local_228.data._M_elems[2];
            local_1c8.data._M_elems[3] = local_228.data._M_elems[3];
            local_1c8.data._M_elems[4] = local_228.data._M_elems[4];
            local_1c8.data._M_elems[5] = local_228.data._M_elems[5];
            local_1c8.data._M_elems[6] = local_228.data._M_elems[6];
            local_1c8.data._M_elems[7] = local_228.data._M_elems[7];
            local_1c8.data._M_elems[8] = local_228.data._M_elems[8];
            local_1c8.data._M_elems[9] = local_228.data._M_elems[9];
            local_1c8.data._M_elems[10] = local_228.data._M_elems[10];
            local_1c8.data._M_elems[0xb] = local_228.data._M_elems[0xb];
            local_1c8.data._M_elems[0xc] = local_228.data._M_elems[0xc];
            local_1c8.data._M_elems[0xd] = local_228.data._M_elems[0xd];
            local_1c8.data._M_elems._56_5_ = local_228.data._M_elems._56_5_;
            local_1c8.data._M_elems[0xf]._1_3_ = local_228.data._M_elems[0xf]._1_3_;
            local_1c8.exp = local_228.exp;
            local_1c8.neg = local_228.neg;
            local_1c8.fpclass = local_228.fpclass;
            local_1c8.prec_elem = local_228.prec_elem;
            if (local_228.fpclass == cpp_dec_float_NaN) {
              uVar13._4_4_ = local_228.prec_elem;
              uVar13._0_4_ = cpp_dec_float_NaN;
              local_1c8.data._M_elems._0_8_ = uVar3;
LAB_003ec8c9:
              local_228.data._M_elems[0xc] = local_1c8.data._M_elems[0xc];
              local_228.data._M_elems[0xd] = local_1c8.data._M_elems[0xd];
              local_228.data._M_elems._56_5_ = local_1c8.data._M_elems._56_5_;
              local_228.data._M_elems[0xf]._1_3_ = local_1c8.data._M_elems[0xf]._1_3_;
              local_228.data._M_elems[8] = local_1c8.data._M_elems[8];
              local_228.data._M_elems[9] = local_1c8.data._M_elems[9];
              local_228.data._M_elems[10] = local_1c8.data._M_elems[10];
              local_228.data._M_elems[0xb] = local_1c8.data._M_elems[0xb];
              local_228.data._M_elems[4] = local_1c8.data._M_elems[4];
              local_228.data._M_elems[5] = local_1c8.data._M_elems[5];
              local_228.data._M_elems[6] = local_1c8.data._M_elems[6];
              local_228.data._M_elems[7] = local_1c8.data._M_elems[7];
              local_228.data._M_elems[0] = local_1c8.data._M_elems[0];
              local_228.data._M_elems[1] = local_1c8.data._M_elems[1];
              local_228.data._M_elems[2] = local_1c8.data._M_elems[2];
              local_228.data._M_elems[3] = local_1c8.data._M_elems[3];
              vec = local_170;
              iVar5 = local_1c8.exp;
              bVar6 = local_1c8.neg;
            }
            else {
              boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::
              cpp_dec_float<long_long>(&local_228,0,(type *)0x0);
              iVar5 = boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::compare
                                (&local_1c8,&local_228);
              vec = local_170;
              uVar13 = local_1c8._72_8_;
              if (iVar5 != 0) goto LAB_003ec8c9;
              local_228.fpclass = cpp_dec_float_finite;
              local_228.prec_elem = 0x10;
              local_228.data._M_elems[0] = 0;
              local_228.data._M_elems[1] = 0;
              local_228.data._M_elems[2] = 0;
              local_228.data._M_elems[3] = 0;
              local_228.data._M_elems[4] = 0;
              local_228.data._M_elems[5] = 0;
              local_228.data._M_elems[6] = 0;
              local_228.data._M_elems[7] = 0;
              local_228.data._M_elems[8] = 0;
              local_228.data._M_elems[9] = 0;
              local_228.data._M_elems[10] = 0;
              local_228.data._M_elems[0xb] = 0;
              local_228.data._M_elems[0xc] = 0;
              local_228.data._M_elems[0xd] = 0;
              local_228.data._M_elems._56_5_ = 0;
              local_228.data._M_elems[0xf]._1_3_ = 0;
              local_228.exp = 0;
              local_228.neg = false;
              boost::multiprecision::backends::cpp_dec_float<100u,int,void>::operator=
                        ((cpp_dec_float<100u,int,void> *)&local_228,1e-100);
              iVar5 = local_228.exp;
              bVar6 = local_228.neg;
              uVar13 = local_228._72_8_;
            }
            piVar11 = piVar11 + 1;
            pnVar12 = vec + iVar2;
            n = local_1cc + local_1d0;
            pcVar9 = pcVar9 + 1;
            *(undefined8 *)((pnVar12->m_backend).data._M_elems + 0xc) =
                 local_228.data._M_elems._48_8_;
            *(ulong *)((pnVar12->m_backend).data._M_elems + 0xe) =
                 CONCAT35(local_228.data._M_elems[0xf]._1_3_,local_228.data._M_elems._56_5_);
            *(undefined8 *)((pnVar12->m_backend).data._M_elems + 8) = local_228.data._M_elems._32_8_
            ;
            *(undefined8 *)((pnVar12->m_backend).data._M_elems + 10) =
                 local_228.data._M_elems._40_8_;
            *(undefined8 *)((pnVar12->m_backend).data._M_elems + 4) = local_228.data._M_elems._16_8_
            ;
            *(undefined8 *)((pnVar12->m_backend).data._M_elems + 6) = local_228.data._M_elems._24_8_
            ;
            *(undefined8 *)(pnVar12->m_backend).data._M_elems = local_228.data._M_elems._0_8_;
            *(undefined8 *)((pnVar12->m_backend).data._M_elems + 2) = local_228.data._M_elems._8_8_;
            (pnVar12->m_backend).exp = iVar5;
            (pnVar12->m_backend).neg = bVar6;
            (pnVar12->m_backend).fpclass = (fpclass_type)uVar13;
            (pnVar12->m_backend).prec_elem = SUB84(uVar13,4);
            iVar4 = iVar4 + -1;
          } while ((int)local_130 < iVar4);
        }
      }
      lVar10 = local_140 + 1;
    } while (local_1d4 != (int)lVar10);
  }
  return n;
}

Assistant:

int CLUFactor<R>::vSolveUpdateRight(R* vec, int* ridx, int n, R eps)
{
   int i, j, k;
   int end;
   R x, y;
   R* lval, *val;
   int* lrow, *lidx, *idx;
   int* lbeg;

   assert(!l.updateType);               /* no Forest-Tomlin Updates */

   lval = l.val.data();
   lidx = l.idx;
   lrow = l.row;
   lbeg = l.start;
   end = l.firstUnused;

   for(i = l.firstUpdate; i < end; ++i)
   {
      assert(i >= 0 && i < thedim);
      x = vec[lrow[i]];

      if(isNotZero(x, eps))
      {
         k = lbeg[i];
         assert(k >= 0 && k < l.size);
         idx = &(lidx[k]);
         val = &(lval[k]);

         for(j = lbeg[i + 1]; j > k; --j)
         {
            int m = ridx[n] = *idx++;
            assert(m >= 0 && m < thedim);
            y = vec[m];
            n += (y == 0) ? 1 : 0;
            y = y - x * (*val++);
            vec[m] = (y != 0) ? y : SOPLEX_FACTOR_MARKER;
         }
      }
   }

   return n;
}